

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,duckdb::interval_t,duckdb::GreaterThan,true,false,true,true>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  ulong uVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  bool bVar6;
  ulong uVar7;
  int64_t *piVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  sel_t sVar17;
  idx_t iVar18;
  ulong uVar19;
  long lVar20;
  int64_t lmicros;
  int64_t ldays;
  interval_t *input;
  
  if (count + 0x3f < 0x40) {
    iVar18 = 0;
  }
  else {
    puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar18 = 0;
    lVar10 = 0;
    uVar14 = 0;
    uVar9 = 0;
    do {
      uVar7 = uVar14;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar19 = uVar14 + 0x40;
        if (count <= uVar14 + 0x40) {
          uVar19 = count;
        }
LAB_0042c6e0:
        if (uVar14 < uVar19) {
          psVar3 = sel->sel_vector;
          lVar12 = ldata->micros;
          lVar16 = (long)ldata->days + lVar12 / 86400000000;
          lVar11 = lVar16 % 0x1e;
          lVar16 = (long)ldata->months + lVar16 / 0x1e;
          psVar4 = true_sel->sel_vector;
          psVar5 = false_sel->sel_vector;
          piVar8 = &rdata[uVar14].micros;
          do {
            uVar7 = uVar14;
            if (psVar3 != (sel_t *)0x0) {
              uVar7 = (ulong)psVar3[uVar14];
            }
            lVar20 = (long)*(int32_t *)((long)piVar8 + -4) + *piVar8 / 86400000000;
            lVar15 = (long)((interval_t *)(piVar8 + -1))->months + lVar20 / 0x1e;
            bVar6 = true;
            if (lVar16 <= lVar15) {
              if (lVar16 < lVar15) {
                bVar6 = false;
              }
              else {
                lVar20 = lVar20 % 0x1e;
                if (lVar11 <= lVar20) {
                  bVar6 = *piVar8 % 86400000000 < lVar12 % 86400000000 && lVar20 <= lVar11;
                }
              }
            }
            psVar4[iVar18] = (sel_t)uVar7;
            iVar18 = iVar18 + bVar6;
            psVar5[lVar10] = (sel_t)uVar7;
            lVar10 = (ulong)(bVar6 ^ 1) + lVar10;
            uVar14 = uVar14 + 1;
            piVar8 = piVar8 + 2;
            uVar7 = uVar19;
          } while (uVar19 != uVar14);
        }
      }
      else {
        uVar2 = puVar1[uVar9];
        uVar19 = uVar14 + 0x40;
        if (count <= uVar14 + 0x40) {
          uVar19 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_0042c6e0;
        if (uVar2 == 0) {
          uVar7 = uVar19;
          if (uVar14 < uVar19) {
            psVar3 = sel->sel_vector;
            psVar4 = false_sel->sel_vector;
            do {
              sVar17 = (sel_t)uVar14;
              if (psVar3 != (sel_t *)0x0) {
                sVar17 = psVar3[uVar14];
              }
              psVar4[lVar10] = sVar17;
              lVar10 = lVar10 + 1;
              uVar14 = uVar14 + 1;
            } while (uVar19 != uVar14);
          }
        }
        else if (uVar14 < uVar19) {
          psVar3 = sel->sel_vector;
          psVar4 = true_sel->sel_vector;
          psVar5 = false_sel->sel_vector;
          piVar8 = &rdata[uVar14].micros;
          uVar13 = 0;
          do {
            if (psVar3 == (sel_t *)0x0) {
              sVar17 = (int)uVar14 + (int)uVar13;
            }
            else {
              sVar17 = psVar3[uVar14 + uVar13];
            }
            if ((uVar2 >> (uVar13 & 0x3f) & 1) == 0) {
              bVar6 = false;
            }
            else {
              lVar20 = (long)ldata->days + ldata->micros / 86400000000;
              lVar11 = (long)ldata->months + lVar20 / 0x1e;
              lVar12 = (long)*(int32_t *)((long)piVar8 + -4) + *piVar8 / 86400000000;
              lVar16 = (long)((interval_t *)(piVar8 + -1))->months + lVar12 / 0x1e;
              bVar6 = true;
              if (lVar11 <= lVar16) {
                if (lVar11 < lVar16) {
                  bVar6 = false;
                }
                else {
                  lVar20 = lVar20 % 0x1e;
                  lVar12 = lVar12 % 0x1e;
                  bVar6 = true;
                  if (lVar20 <= lVar12) {
                    bVar6 = *piVar8 % 86400000000 < ldata->micros % 86400000000 && lVar12 <= lVar20;
                  }
                }
              }
            }
            psVar4[iVar18] = sVar17;
            iVar18 = iVar18 + bVar6;
            psVar5[lVar10] = sVar17;
            lVar10 = (ulong)(bVar6 ^ 1) + lVar10;
            uVar13 = uVar13 + 1;
            piVar8 = piVar8 + 2;
            uVar7 = uVar19;
          } while (uVar19 - uVar14 != uVar13);
        }
      }
      uVar14 = uVar7;
      uVar9 = uVar9 + 1;
    } while (uVar9 != count + 0x3f >> 6);
  }
  return iVar18;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}